

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_union.c
# Opt level: O3

_Bool array_array_container_union
                (array_container_t *src_1,array_container_t *src_2,container_t **dst)

{
  array_container_t *paVar1;
  bitset_container_t *bits;
  uint64_t uVar2;
  int size;
  bitset_container_t *ourbitset;
  
  size = src_2->cardinality + src_1->cardinality;
  if (size < 0x1001) {
    paVar1 = array_container_create_given_capacity(size);
    *dst = paVar1;
    if (paVar1 == (array_container_t *)0x0) {
      return true;
    }
    array_container_union(src_1,src_2,paVar1);
  }
  else {
    bits = bitset_container_create();
    *dst = bits;
    if (bits == (bitset_container_t *)0x0) {
      return true;
    }
    bitset_set_list(bits->words,src_1->array,(long)src_1->cardinality);
    uVar2 = bitset_set_list_withcard
                      (bits->words,(long)src_1->cardinality,src_2->array,(long)src_2->cardinality);
    bits->cardinality = (int)uVar2;
    if (0x1000 < (int)uVar2) {
      return true;
    }
    paVar1 = array_container_from_bitset(bits);
    *dst = paVar1;
    bitset_container_free(bits);
  }
  return false;
}

Assistant:

bool array_array_container_union(const array_container_t *src_1,
                                 const array_container_t *src_2,
                                 container_t **dst) {
    int totalCardinality = src_1->cardinality + src_2->cardinality;
    if (totalCardinality <= DEFAULT_MAX_SIZE) {
        *dst = array_container_create_given_capacity(totalCardinality);
        if (*dst != NULL) {
            array_container_union(src_1, src_2, CAST_array(*dst));
        } else {
            return true;  // otherwise failure won't be caught
        }
        return false;  // not a bitset
    }
    *dst = bitset_container_create();
    bool returnval = true;  // expect a bitset
    if (*dst != NULL) {
        bitset_container_t *ourbitset = CAST_bitset(*dst);
        bitset_set_list(ourbitset->words, src_1->array, src_1->cardinality);
        ourbitset->cardinality = (int32_t)bitset_set_list_withcard(
            ourbitset->words, src_1->cardinality, src_2->array,
            src_2->cardinality);
        if (ourbitset->cardinality <= DEFAULT_MAX_SIZE) {
            // need to convert!
            *dst = array_container_from_bitset(ourbitset);
            bitset_container_free(ourbitset);
            returnval = false;  // not going to be a bitset
        }
    }
    return returnval;
}